

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

void __thiscall tokenizer::read_identifier(tokenizer *this)

{
  char __c;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = this->line_char;
  this->last_line_number = this->line_number;
  this->last_position_number = this->position_number;
  while( true ) {
    __c = *pcVar3;
    if (__c == '\0') break;
    iVar2 = isalnum((int)__c);
    if ((__c != '_') && (iVar2 == 0)) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&this->current_word,__c);
    pcVar3 = this->line_char + 1;
    this->line_char = pcVar3;
  }
  bVar1 = read_keyword_if_any(this);
  if (!bVar1) {
    add_token_to_stream(this,identifier);
  }
  this->position_number = this->position_number + (int)(this->current_word)._M_string_length;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&this->current_word,"");
  return;
}

Assistant:

void tokenizer::read_identifier() {
    last_line_number = line_number;
    last_position_number = position_number;

    while(*line_char != '\0') {
        if(isalnum(*line_char) || *line_char == '_') {
            current_word += *line_char;
            line_char++;
        }
        else {
            break;
        }
    }

    if(!this->read_keyword_if_any()){
        this->add_token_to_stream(Token_Type::identifier);
    }

    position_number += current_word.length();
    current_word = "";
}